

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ForVariableDeclarationSyntax::getChild
          (ForVariableDeclarationSyntax *this,size_t index)

{
  Token token;
  long in_RDX;
  ConstTokenOrSyntax *in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffb8;
  Info *pIVar1;
  
  if (in_RDX == 0) {
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffffb8;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x39ac58,token);
  }
  else if (in_RDX == 1) {
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)in_RDI,in_stack_ffffffffffffffb8);
  }
  else if (in_RDX == 2) {
    pIVar1 = in_RDI;
    not_null<slang::syntax::DeclaratorSyntax_*>::get
              ((not_null<slang::syntax::DeclaratorSyntax_*> *)(in_RSI + 2));
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)in_RDI,in_stack_ffffffffffffffb8);
    in_RDI = pIVar1;
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RSI,in_RDI);
  }
  return (ConstTokenOrSyntax *)in_RDI;
}

Assistant:

ConstTokenOrSyntax ForVariableDeclarationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return varKeyword;
        case 1: return type;
        case 2: return declarator.get();
        default: return nullptr;
    }
}